

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O1

Mat * __thiscall
ncnn::ModelBinFromDataReader::load
          (Mat *__return_storage_ptr__,ModelBinFromDataReader *this,int w,int type)

{
  DataReader *pDVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  size_t __n;
  anon_union_4_2_77b30072 flag_struct;
  vector<unsigned_short,_std::allocator<unsigned_short>_> float16_weights;
  void *refbuf;
  vector<signed_char,_std::allocator<signed_char>_> int8_weights;
  Mat local_498;
  uint local_44c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_448;
  unsigned_short *local_430;
  Mat local_428 [14];
  
  local_498.cstep = 0;
  local_498.data = (unsigned_short *)0x0;
  local_498.refcount._0_4_ = 0;
  local_498.refcount._4_4_ = 0;
  local_498.elemsize._0_4_ = 0;
  local_498.elemsize._4_4_ = 0;
  local_498.elempack = 0;
  local_498.allocator = (Allocator *)0x0;
  local_498.dims = 0;
  local_498.w = 0;
  local_498.h = 0;
  local_498.d = 0;
  local_498.c = 0;
  if (type == 1) {
    local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pDVar1 = this->d->dr;
    sVar7 = (size_t)w;
    lVar3 = sVar7 * 4;
    lVar5 = (**(code **)(*(long *)pDVar1 + 0x20))(pDVar1,lVar3);
    if (lVar5 == lVar3) {
      local_428[0].data =
           local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_428[0].refcount._0_4_ = 0;
      local_428[0].refcount._4_4_ = 0;
      local_428[0].elemsize._0_4_ = 4;
      local_428[0].elemsize._4_4_ = 0;
      local_428[0].elempack = 1;
      local_428[0].allocator = (Allocator *)0x0;
      local_428[0].w = w;
      local_428[0].dims = 1;
      local_428[0].h = 1;
      local_428[0].d = 1;
      local_428[0].c = 1;
      piVar2 = (int *)CONCAT44(local_498.refcount._4_4_,local_498.refcount._0_4_);
      local_428[0].cstep = sVar7;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_498.allocator == (Allocator *)0x0) {
            if ((unsigned_short *)local_498.data != (unsigned_short *)0x0) {
              free(local_498.data);
            }
          }
          else {
            (**(code **)(*(long *)local_498.allocator + 0x18))();
          }
        }
      }
      piVar2 = (int *)CONCAT44(local_428[0].refcount._4_4_,local_428[0].refcount._0_4_);
      local_498.data = local_428[0].data;
      local_498.refcount._0_4_ = local_428[0].refcount._0_4_;
      local_498.refcount._4_4_ = local_428[0].refcount._4_4_;
      local_498.elemsize._0_4_ = (undefined4)local_428[0].elemsize;
      local_498.elemsize._4_4_ = local_428[0].elemsize._4_4_;
      local_498.elempack = local_428[0].elempack;
      local_498.allocator = local_428[0].allocator;
      local_498.dims = local_428[0].dims;
      local_498.w = local_428[0].w;
      local_498.h = local_428[0].h;
      local_498.d = local_428[0].d;
      local_498.c = local_428[0].c;
      local_498.cstep = local_428[0].cstep;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_428[0].allocator == (Allocator *)0x0) goto LAB_00157abb;
          (**(code **)(*(long *)local_428[0].allocator + 0x18))();
        }
      }
      goto LAB_00157acb;
    }
    Mat::create(&local_498,w,4,(Allocator *)0x0);
    if (((unsigned_short *)local_498.data != (unsigned_short *)0x0) &&
       ((long)local_498.c * local_498.cstep != 0)) {
      pDVar1 = this->d->dr;
      lVar5 = (**(code **)(*(long *)pDVar1 + 0x18))(pDVar1,local_498.data,lVar3);
      if (lVar5 != lVar3) {
        load();
        goto LAB_00157b37;
      }
      goto LAB_00157af1;
    }
LAB_001578a3:
    __return_storage_ptr__->data = local_498.data;
  }
  else {
    if (type != 0) {
      load();
      goto LAB_00157b37;
    }
    pDVar1 = this->d->dr;
    lVar3 = (**(code **)(*(long *)pDVar1 + 0x18))(pDVar1,&local_44c,4);
    if (lVar3 != 4) {
      load();
      goto LAB_00157b37;
    }
    if (local_44c == 0x2c056) {
      local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pDVar1 = this->d->dr;
      sVar7 = (size_t)w;
      lVar3 = sVar7 * 4;
      lVar5 = (**(code **)(*(long *)pDVar1 + 0x20))(pDVar1,lVar3);
      if (lVar5 != lVar3) {
        Mat::create(&local_498,w,4,(Allocator *)0x0);
        if (((unsigned_short *)local_498.data == (unsigned_short *)0x0) ||
           ((long)local_498.c * local_498.cstep == 0)) goto LAB_001578a3;
        pDVar1 = this->d->dr;
        lVar5 = (**(code **)(*(long *)pDVar1 + 0x18))(pDVar1,local_498.data,lVar3);
        if (lVar5 != lVar3) {
          load();
          goto LAB_00157b37;
        }
        goto LAB_00157af1;
      }
      local_428[0].data =
           local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_428[0].refcount._0_4_ = 0;
      local_428[0].refcount._4_4_ = 0;
      local_428[0].elemsize._0_4_ = 4;
      local_428[0].elemsize._4_4_ = 0;
      local_428[0].elempack = 1;
      local_428[0].allocator = (Allocator *)0x0;
      local_428[0].w = w;
      local_428[0].dims = 1;
      local_428[0].h = 1;
      local_428[0].d = 1;
      local_428[0].c = 1;
      piVar2 = (int *)CONCAT44(local_498.refcount._4_4_,local_498.refcount._0_4_);
      local_428[0].cstep = sVar7;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_498.allocator == (Allocator *)0x0) {
            if ((unsigned_short *)local_498.data != (unsigned_short *)0x0) {
              free(local_498.data);
            }
          }
          else {
            (**(code **)(*(long *)local_498.allocator + 0x18))();
          }
        }
      }
      piVar2 = (int *)CONCAT44(local_428[0].refcount._4_4_,local_428[0].refcount._0_4_);
      local_498.data = local_428[0].data;
      local_498.refcount._0_4_ = local_428[0].refcount._0_4_;
      local_498.refcount._4_4_ = local_428[0].refcount._4_4_;
      local_498.elemsize._0_4_ = (undefined4)local_428[0].elemsize;
      local_498.elemsize._4_4_ = local_428[0].elemsize._4_4_;
      local_498.elempack = local_428[0].elempack;
      local_498.allocator = local_428[0].allocator;
      local_498.dims = local_428[0].dims;
      local_498.w = local_428[0].w;
      local_498.h = local_428[0].h;
      local_498.d = local_428[0].d;
      local_498.c = local_428[0].c;
      local_498.cstep = local_428[0].cstep;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_428[0].allocator == (Allocator *)0x0) {
LAB_00157abb:
            local_498.data = local_428[0].data;
            local_498.refcount._0_4_ = local_428[0].refcount._0_4_;
            local_498.refcount._4_4_ = local_428[0].refcount._4_4_;
            local_498.elemsize._0_4_ = (undefined4)local_428[0].elemsize;
            local_498.elemsize._4_4_ = local_428[0].elemsize._4_4_;
            local_498.elempack = local_428[0].elempack;
            local_498.allocator = local_428[0].allocator;
            local_498.c = local_428[0].c;
            local_498.cstep = local_428[0].cstep;
            if ((unsigned_short *)local_428[0].data != (unsigned_short *)0x0) {
              free(local_428[0].data);
            }
          }
          else {
            (**(code **)(*(long *)local_428[0].allocator + 0x18))();
          }
        }
      }
LAB_00157acb:
      local_428[0].cstep = 0;
      local_428[0].data = (unsigned_short *)0x0;
      local_428[0].refcount._0_4_ = 0;
      local_428[0].refcount._4_4_ = 0;
      local_428[0].elemsize._0_4_ = 0;
      local_428[0].elemsize._4_4_ = 0;
      local_428[0].elempack = 0;
      local_428[0].dims = 0;
      local_428[0].w = 0;
      local_428[0].h = 0;
      local_428[0].d = 0;
      local_428[0].c = 0;
    }
    else {
      if (local_44c == 0xd4b38) {
        __n = (size_t)w;
        uVar8 = __n + 3 & 0xfffffffffffffffc;
        local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pDVar1 = this->d->dr;
        uVar4 = (**(code **)(*(long *)pDVar1 + 0x20))(pDVar1,uVar8);
        if (uVar4 != uVar8) {
          local_428[0].data = (unsigned_short *)0x0;
          local_428[0].refcount._0_4_ = 0;
          local_428[0].refcount._4_4_ = 0;
          local_428[0].elemsize._0_4_ = 0;
          local_428[0].elemsize._4_4_ = 0;
          std::vector<signed_char,_std::allocator<signed_char>_>::resize
                    ((vector<signed_char,_std::allocator<signed_char>_> *)local_428,uVar8);
          pDVar1 = this->d->dr;
          uVar4 = (**(code **)(*(long *)pDVar1 + 0x18))(pDVar1,local_428[0].data,uVar8);
          if (uVar4 == uVar8) {
            Mat::create(&local_498,w,1,(Allocator *)0x0);
            if (((unsigned_short *)local_498.data != (unsigned_short *)0x0) &&
               ((long)local_498.c * local_498.cstep != 0)) {
              memcpy(local_498.data,local_428[0].data,__n);
              if ((unsigned_short *)local_428[0].data != (unsigned_short *)0x0) {
                operator_delete(local_428[0].data,
                                CONCAT44(local_428[0].elemsize._4_4_,
                                         (undefined4)local_428[0].elemsize) -
                                (long)local_428[0].data);
              }
              goto LAB_00157af1;
            }
            __return_storage_ptr__->data = local_498.data;
            piVar2 = (int *)CONCAT44(local_498.refcount._4_4_,local_498.refcount._0_4_);
            __return_storage_ptr__->refcount = piVar2;
            __return_storage_ptr__->elemsize =
                 CONCAT44(local_498.elemsize._4_4_,(undefined4)local_498.elemsize);
            __return_storage_ptr__->elempack = local_498.elempack;
            __return_storage_ptr__->allocator = local_498.allocator;
            __return_storage_ptr__->dims = local_498.dims;
            __return_storage_ptr__->w = local_498.w;
            __return_storage_ptr__->h = local_498.h;
            __return_storage_ptr__->d = local_498.d;
            __return_storage_ptr__->c = local_498.c;
            __return_storage_ptr__->cstep = local_498.cstep;
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + 1;
              UNLOCK();
            }
          }
          else {
            load();
          }
          if ((unsigned_short *)local_428[0].data != (unsigned_short *)0x0) {
            operator_delete(local_428[0].data,
                            CONCAT44(local_428[0].elemsize._4_4_,(undefined4)local_428[0].elemsize)
                            - (long)local_428[0].data);
          }
          goto LAB_00157b37;
        }
        local_428[0].data =
             local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_428[0].refcount._0_4_ = 0;
        local_428[0].refcount._4_4_ = 0;
        local_428[0].elemsize._0_4_ = 1;
        local_428[0].elemsize._4_4_ = 0;
        local_428[0].elempack = 1;
        local_428[0].allocator = (Allocator *)0x0;
        local_428[0].w = w;
        local_428[0].dims = 1;
        local_428[0].h = 1;
        local_428[0].d = 1;
        local_428[0].c = 1;
        piVar2 = (int *)CONCAT44(local_498.refcount._4_4_,local_498.refcount._0_4_);
        local_428[0].cstep = __n;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (local_498.allocator == (Allocator *)0x0) {
              if ((unsigned_short *)local_498.data != (unsigned_short *)0x0) {
                free(local_498.data);
              }
            }
            else {
              (**(code **)(*(long *)local_498.allocator + 0x18))();
            }
          }
        }
        piVar2 = (int *)CONCAT44(local_428[0].refcount._4_4_,local_428[0].refcount._0_4_);
        local_498.data = local_428[0].data;
        local_498.refcount._0_4_ = local_428[0].refcount._0_4_;
        local_498.refcount._4_4_ = local_428[0].refcount._4_4_;
        local_498.elemsize._0_4_ = (undefined4)local_428[0].elemsize;
        local_498.elemsize._4_4_ = local_428[0].elemsize._4_4_;
        local_498.elempack = local_428[0].elempack;
        local_498.allocator = local_428[0].allocator;
        local_498.dims = local_428[0].dims;
        local_498.w = local_428[0].w;
        local_498.h = local_428[0].h;
        local_498.d = local_428[0].d;
        local_498.c = local_428[0].c;
        local_498.cstep = local_428[0].cstep;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (local_428[0].allocator == (Allocator *)0x0) goto LAB_00157abb;
            (**(code **)(*(long *)local_428[0].allocator + 0x18))();
          }
        }
        goto LAB_00157acb;
      }
      if (local_44c == 0x1306b47) {
        uVar8 = (long)w * 2 + 3U & 0xfffffffffffffffc;
        local_430 = (unsigned_short *)0x0;
        pDVar1 = this->d->dr;
        uVar4 = (**(code **)(*(long *)pDVar1 + 0x20))(pDVar1,uVar8);
        if (uVar4 == uVar8) {
          Mat::from_float16(local_428,local_430,w);
          piVar2 = (int *)CONCAT44(local_428[0].refcount._4_4_,local_428[0].refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
          piVar2 = (int *)CONCAT44(local_498.refcount._4_4_,local_498.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (local_498.allocator == (Allocator *)0x0) {
                if ((unsigned_short *)local_498.data != (unsigned_short *)0x0) {
                  free(local_498.data);
                }
              }
              else {
                (**(code **)(*(long *)local_498.allocator + 0x18))();
              }
            }
          }
          piVar2 = (int *)CONCAT44(local_428[0].refcount._4_4_,local_428[0].refcount._0_4_);
          local_498.data = local_428[0].data;
          local_498.refcount._0_4_ = local_428[0].refcount._0_4_;
          local_498.refcount._4_4_ = local_428[0].refcount._4_4_;
          local_498.elemsize._0_4_ = (undefined4)local_428[0].elemsize;
          local_498.elemsize._4_4_ = local_428[0].elemsize._4_4_;
          local_498.elempack = local_428[0].elempack;
          local_498.allocator = local_428[0].allocator;
          local_498.dims = local_428[0].dims;
          local_498.w = local_428[0].w;
          local_498.h = local_428[0].h;
          local_498.d = local_428[0].d;
          local_498.c = local_428[0].c;
          local_498.cstep = local_428[0].cstep;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (local_428[0].allocator == (Allocator *)0x0) goto LAB_00157abb;
              (**(code **)(*(long *)local_428[0].allocator + 0x18))();
            }
          }
          goto LAB_00157acb;
        }
        local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_448,uVar8);
        pDVar1 = this->d->dr;
        uVar4 = (**(code **)(*(long *)pDVar1 + 0x18))
                          (pDVar1,local_448.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,uVar8);
        if (uVar4 == uVar8) {
          Mat::from_float16(local_428,
                            (unsigned_short *)
                            local_448.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,w);
          piVar2 = (int *)CONCAT44(local_428[0].refcount._4_4_,local_428[0].refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
          piVar2 = (int *)CONCAT44(local_498.refcount._4_4_,local_498.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (local_498.allocator == (Allocator *)0x0) {
                if ((unsigned_short *)local_498.data != (unsigned_short *)0x0) {
                  free(local_498.data);
                }
              }
              else {
                (**(code **)(*(long *)local_498.allocator + 0x18))();
              }
            }
          }
          piVar2 = (int *)CONCAT44(local_428[0].refcount._4_4_,local_428[0].refcount._0_4_);
          local_498.data = local_428[0].data;
          local_498.refcount._0_4_ = local_428[0].refcount._0_4_;
          local_498.refcount._4_4_ = local_428[0].refcount._4_4_;
          local_498.elemsize._0_4_ = (undefined4)local_428[0].elemsize;
          local_498.elemsize._4_4_ = local_428[0].elemsize._4_4_;
          local_498.elempack = local_428[0].elempack;
          local_498.allocator = local_428[0].allocator;
          local_498.dims = local_428[0].dims;
          local_498.w = local_428[0].w;
          local_498.h = local_428[0].h;
          local_498.d = local_428[0].d;
          local_498.c = local_428[0].c;
          local_498.cstep = local_428[0].cstep;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (local_428[0].allocator == (Allocator *)0x0) {
                if ((unsigned_short *)local_428[0].data != (unsigned_short *)0x0) {
                  free(local_428[0].data);
                }
              }
              else {
                (**(code **)(*(long *)local_428[0].allocator + 0x18))();
              }
            }
          }
          local_428[0].cstep = 0;
          local_428[0].data = (unsigned_short *)0x0;
          local_428[0].refcount._0_4_ = 0;
          local_428[0].refcount._4_4_ = 0;
          local_428[0].elemsize._0_4_ = 0;
          local_428[0].elemsize._4_4_ = 0;
          local_428[0].elempack = 0;
          local_428[0].dims = 0;
          local_428[0].w = 0;
          local_428[0].h = 0;
          local_428[0].d = 0;
          local_428[0].c = 0;
        }
        else {
          load();
        }
LAB_00157c54:
        if ((unsigned_short *)
            local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (unsigned_short *)0x0) {
          operator_delete(local_448.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_448.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_448.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (uVar4 != uVar8) goto LAB_00157b37;
      }
      else if ((local_44c >> 0x10 & 0xff) + (local_44c >> 8 & 0xff) + (local_44c & 0xff) == 0 &&
               local_44c >> 0x18 == 0) {
        if ((char)local_44c == '\0') {
          local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          pDVar1 = this->d->dr;
          lVar3 = (long)w * 4;
          lVar5 = (**(code **)(*(long *)pDVar1 + 0x20))(pDVar1,lVar3);
          if (lVar5 == lVar3) {
            local_428[0].data =
                 local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
            local_428[0].refcount._0_4_ = 0;
            local_428[0].refcount._4_4_ = 0;
            local_428[0].elemsize._0_4_ = 4;
            local_428[0].elemsize._4_4_ = 0;
            local_428[0].elempack = 1;
            local_428[0].allocator = (Allocator *)0x0;
            local_428[0].w = w;
            local_428[0].dims = 1;
            local_428[0].h = 1;
            local_428[0].d = 1;
            local_428[0].c = 1;
            local_428[0].cstep = (long)w;
            Mat::operator=(&local_498,local_428);
            Mat::~Mat(local_428);
          }
          else {
            Mat::create(&local_498,w,4,(Allocator *)0x0);
            if (((unsigned_short *)local_498.data == (unsigned_short *)0x0) ||
               ((long)local_498.c * local_498.cstep == 0)) goto LAB_001578a3;
            pDVar1 = this->d->dr;
            lVar5 = (**(code **)(*(long *)pDVar1 + 0x18))(pDVar1,local_498.data,lVar3);
            if (lVar5 != lVar3) {
              load();
              goto LAB_00157b37;
            }
          }
        }
      }
      else {
        Mat::create(&local_498,w,4,(Allocator *)0x0);
        if (((unsigned_short *)local_498.data != (unsigned_short *)0x0) &&
           ((long)local_498.c * local_498.cstep != 0)) {
          pDVar1 = this->d->dr;
          lVar3 = (**(code **)(*(long *)pDVar1 + 0x18))(pDVar1,local_428,0x400);
          if (lVar3 != 0x400) {
            load();
            goto LAB_00157b37;
          }
          uVar8 = (long)w + 3U & 0xfffffffffffffffc;
          local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_448,uVar8);
          pDVar1 = this->d->dr;
          uVar4 = (**(code **)(*(long *)pDVar1 + 0x18))
                            (pDVar1,local_448.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,uVar8);
          if (uVar4 == uVar8) {
            if (0 < w) {
              uVar6 = 0;
              do {
                *(undefined4 *)((long)local_498.data + uVar6 * 2 * 2) =
                     *(undefined4 *)
                      ((long)&local_428[0].data +
                      (ulong)*(byte *)((long)local_448.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start + uVar6) * 4)
                ;
                uVar6 = uVar6 + 1;
              } while ((uint)w != uVar6);
            }
          }
          else {
            load();
          }
          goto LAB_00157c54;
        }
      }
    }
LAB_00157af1:
    __return_storage_ptr__->data = local_498.data;
  }
  piVar2 = (int *)CONCAT44(local_498.refcount._4_4_,local_498.refcount._0_4_);
  __return_storage_ptr__->refcount = piVar2;
  __return_storage_ptr__->elemsize =
       CONCAT44(local_498.elemsize._4_4_,(undefined4)local_498.elemsize);
  __return_storage_ptr__->elempack = local_498.elempack;
  __return_storage_ptr__->allocator = local_498.allocator;
  __return_storage_ptr__->dims = local_498.dims;
  __return_storage_ptr__->w = local_498.w;
  __return_storage_ptr__->h = local_498.h;
  __return_storage_ptr__->d = local_498.d;
  __return_storage_ptr__->c = local_498.c;
  __return_storage_ptr__->cstep = local_498.cstep;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
  }
LAB_00157b37:
  piVar2 = (int *)CONCAT44(local_498.refcount._4_4_,local_498.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_498.allocator == (Allocator *)0x0) {
        if ((unsigned_short *)local_498.data != (unsigned_short *)0x0) {
          free(local_498.data);
        }
      }
      else {
        (**(code **)(*(long *)local_498.allocator + 0x18))();
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromDataReader::load(int w, int type) const
{
    Mat m;

    if (type == 0)
    {
        size_t nread;

        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        nread = d->dr.read(&flag_struct, sizeof(flag_struct));
        if (nread != sizeof(flag_struct))
        {
            NCNN_LOGE("ModelBin read flag_struct failed %zd", nread);
            return Mat();
        }

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            size_t align_data_size = alignSize(w * sizeof(unsigned short), 4);

            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(align_data_size, &refbuf);
            if (nread == align_data_size)
            {
                m = Mat::from_float16((const unsigned short*)refbuf, w);
            }
            else
            {
                std::vector<unsigned short> float16_weights;
                float16_weights.resize(align_data_size);
                nread = d->dr.read(float16_weights.data(), align_data_size);
                if (nread != align_data_size)
                {
                    NCNN_LOGE("ModelBin read float16_weights failed %zd", nread);
                    return Mat();
                }

                m = Mat::from_float16(float16_weights.data(), w);
            }

            return m;
        }
        else if (flag_struct.tag == 0x000D4B38)
        {
            // int8 data
            size_t align_data_size = alignSize(w, 4);

            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(align_data_size, &refbuf);
            if (nread == align_data_size)
            {
                m = Mat(w, (void*)refbuf, (size_t)1u);
            }
            else
            {
                std::vector<signed char> int8_weights;
                int8_weights.resize(align_data_size);
                nread = d->dr.read(int8_weights.data(), align_data_size);
                if (nread != align_data_size)
                {
                    NCNN_LOGE("ModelBin read int8_weights failed %zd", nread);
                    return Mat();
                }

                m.create(w, (size_t)1u);
                if (m.empty())
                    return m;

                memcpy(m.data, int8_weights.data(), w);
            }

            return m;
        }
        else if (flag_struct.tag == 0x0002C056)
        {
            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(w * sizeof(float), &refbuf);
            if (nread == w * sizeof(float))
            {
                m = Mat(w, (void*)refbuf);
            }
            else
            {
                m.create(w);
                if (m.empty())
                    return m;

                // raw data with extra scaling
                nread = d->dr.read(m, w * sizeof(float));
                if (nread != w * sizeof(float))
                {
                    NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                    return Mat();
                }
            }

            return m;
        }

        if (flag != 0)
        {
            m.create(w);
            if (m.empty())
                return m;

            // quantized data
            float quantization_value[256];
            nread = d->dr.read(quantization_value, 256 * sizeof(float));
            if (nread != 256 * sizeof(float))
            {
                NCNN_LOGE("ModelBin read quantization_value failed %zd", nread);
                return Mat();
            }

            size_t align_weight_data_size = alignSize(w * sizeof(unsigned char), 4);
            std::vector<unsigned char> index_array;
            index_array.resize(align_weight_data_size);
            nread = d->dr.read(index_array.data(), align_weight_data_size);
            if (nread != align_weight_data_size)
            {
                NCNN_LOGE("ModelBin read index_array failed %zd", nread);
                return Mat();
            }

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[index_array[i]];
            }
        }
        else if (flag_struct.f0 == 0)
        {
            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(w * sizeof(float), &refbuf);
            if (nread == w * sizeof(float))
            {
                m = Mat(w, (void*)refbuf);
            }
            else
            {
                m.create(w);
                if (m.empty())
                    return m;

                // raw data
                nread = d->dr.read(m, w * sizeof(float));
                if (nread != w * sizeof(float))
                {
                    NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                    return Mat();
                }
            }
        }

        return m;
    }
    else if (type == 1)
    {
        // try reference data
        const void* refbuf = 0;
        size_t nread = d->dr.reference(w * sizeof(float), &refbuf);
        if (nread == w * sizeof(float))
        {
            m = Mat(w, (void*)refbuf);
        }
        else
        {
            m.create(w);
            if (m.empty())
                return m;

            // raw data
            size_t nread = d->dr.read(m, w * sizeof(float));
            if (nread != w * sizeof(float))
            {
                NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                return Mat();
            }
        }

        return m;
    }
    else
    {
        NCNN_LOGE("ModelBin load type %d not implemented", type);
        return Mat();
    }

    return Mat();
}